

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter_tests.c
# Opt level: O2

char * failure_message_xmlNode_has_attribute_equal_to
                 (Constraint *constraint,char *actual_string,intptr_t actual_value)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  xmlChar *pxVar5;
  size_t sVar6;
  size_t sVar7;
  char *__s;
  
  puVar1 = (undefined8 *)(constraint->expected_value).value.pointer_value;
  pxVar5 = getAttribute((xmlNodePtr)actual_value,(xmlChar *)*puVar1);
  iVar2 = xmlStrlen(*puVar1);
  sVar6 = strlen(actual_string);
  sVar7 = strlen(constraint->expected_value_name);
  iVar3 = xmlStrlen(pxVar5);
  iVar4 = xmlStrlen(puVar1[1]);
  sVar6 = sVar7 + sVar6 + (long)iVar2 + (long)iVar3 + (long)iVar4 + 0x5e;
  __s = (char *)malloc(sVar6);
  if (__s == (char *)0x0) {
    (*_xmlFree)(pxVar5);
  }
  else {
    iVar2 = snprintf(__s,sVar6,
                     "Expected attribute [%s] of [%s] to [equal] [%s]\n\tactual value:\t\t[%s]\n\texpected to equal:\t[%s]\n"
                     ,*puVar1,actual_string,constraint->expected_value_name);
    (*_xmlFree)(pxVar5);
    if ((long)iVar2 < (long)sVar6) {
      return __s;
    }
    free(__s);
  }
  return (char *)0x0;
}

Assistant:

static char *failure_message_xmlNode_has_attribute_equal_to(
    Constraint *constraint, const char *actual_string, intptr_t actual_value) {
    struct xmlNode_has_attribute_equal_to *expected =
        (struct xmlNode_has_attribute_equal_to*)constraint->expected_value.value.pointer_value;
    xmlChar* actualValue = getAttribute((xmlNodePtr)actual_value, expected->attr);

    const char *message_template = "Expected attribute [%s] of [%s] to [equal] [%s]\n"
        "\tactual value:\t\t[%s]\n"
        "\texpected to equal:\t[%s]\n";
    size_t msglen = xmlStrlen(expected->attr) + strlen(actual_string) +
        strlen(constraint->expected_value_name) + xmlStrlen(actualValue) +
        xmlStrlen(expected->value) + strlen(message_template);
    char *message = (char*)malloc(msglen);
    if (!message) {
        xmlFree(actualValue);
        return NULL;
    }

    if (snprintf(message, msglen, message_template,
                 expected->attr, actual_string, constraint->expected_value_name,
                 actualValue, expected->value) >= (ssize_t)msglen) {
        xmlFree(actualValue);
        free(message);
        return NULL;
    }

    xmlFree(actualValue);
    return message;
}